

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpscValueQueue.h
# Opt level: O1

ssize_t __thiscall
teetime::SpscValueQueue<teetime::File>::write
          (SpscValueQueue<teetime::File> *this,int __fd,void *__buf,size_t __n)

{
  undefined8 *puVar1;
  __atomic_base<bool> _Var2;
  size_t sVar3;
  Entry *pEVar4;
  undefined8 uVar5;
  undefined7 in_register_00000001;
  size_t sVar6;
  undefined4 in_register_00000034;
  
  sVar3 = this->m_writeIndex;
  pEVar4 = (this->m_array)._M_t.
           super___uniq_ptr_impl<teetime::SpscValueQueue<teetime::File>::Entry,_std::default_delete<teetime::SpscValueQueue<teetime::File>::Entry[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_teetime::SpscValueQueue<teetime::File>::Entry_*,_std::default_delete<teetime::SpscValueQueue<teetime::File>::Entry[]>_>
           .super__Head_base<0UL,_teetime::SpscValueQueue<teetime::File>::Entry_*,_false>.
           _M_head_impl;
  _Var2._M_i = pEVar4[sVar3].hasValue._M_base._M_i;
  if ((_Var2._M_i & 1U) == 0) {
    pEVar4 = pEVar4 + sVar3;
    *(char **)pEVar4->data = pEVar4->data + 0x10;
    puVar1 = (undefined8 *)(CONCAT44(in_register_00000034,__fd) + 0x10);
    if (*(undefined8 **)CONCAT44(in_register_00000034,__fd) == puVar1) {
      uVar5 = *(undefined8 *)(CONCAT44(in_register_00000034,__fd) + 0x18);
      *(undefined8 *)(pEVar4->data + 0x10) = *puVar1;
      *(undefined8 *)(pEVar4->data + 0x18) = uVar5;
    }
    else {
      *(undefined8 **)pEVar4->data = *(undefined8 **)CONCAT44(in_register_00000034,__fd);
      *(undefined8 *)(pEVar4->data + 0x10) = *puVar1;
    }
    *(undefined8 *)(pEVar4->data + 8) = *(undefined8 *)(CONCAT44(in_register_00000034,__fd) + 8);
    *(undefined8 **)CONCAT44(in_register_00000034,__fd) = puVar1;
    *(undefined8 *)(CONCAT44(in_register_00000034,__fd) + 8) = 0;
    *(undefined1 *)(CONCAT44(in_register_00000034,__fd) + 0x10) = 0;
    (pEVar4->hasValue)._M_base._M_i = true;
    sVar6 = sVar3 + 1;
    if (sVar3 + 1 == this->m_capacity) {
      sVar6 = 0;
    }
    this->m_writeIndex = sVar6;
  }
  return CONCAT71(in_register_00000001,~_Var2._M_i) & 0xffffffffffffff01;
}

Assistant:

bool write(T&& t)
  {
    const auto index = m_writeIndex;
    auto& entry = m_array[index];

    if (!entry.hasValue.load(std::memory_order_acquire))
    {
      internal::constructAt<T>(std::move(t), entry.ptr());
      entry.hasValue.store(true, std::memory_order_release);
      const auto next = index + 1;
      m_writeIndex = (next != m_capacity) ? next : 0;
      return true;
    }

    return false;
  }